

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableNeuralNetworkValidator.cpp
# Opt level: O3

Result * validateTrainingInputs<CoreML::Specification::NeuralNetwork>
                   (Result *__return_storage_ptr__,ModelDescription *modelDescription,
                   NeuralNetwork *nn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  long lVar3;
  bool bVar4;
  Type *pTVar5;
  Type *b;
  LogMessage *pLVar6;
  long *plVar7;
  undefined1 *puVar8;
  int iVar9;
  ulong uVar10;
  vector<int,_std::allocator<int>_> trainingInputExclusiveIndices;
  string trainingInputTarget;
  string err;
  string target;
  Result r;
  LogFinisher local_101;
  Result *local_100;
  int *local_f8;
  iterator iStack_f0;
  int *local_e8;
  undefined1 local_d8 [56];
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  NeuralNetwork *local_60;
  Result local_58;
  
  CoreML::Result::Result(&local_58);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  if ((modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x3ba193);
    CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_a0);
    goto LAB_00307c5d;
  }
  local_f8 = (int *)0x0;
  iStack_f0._M_current = (int *)0x0;
  local_e8 = (int *)0x0;
  local_d8._0_8_ = local_d8._0_8_ & 0xffffffff00000000;
  iVar9 = 0;
  local_100 = __return_storage_ptr__;
  local_60 = nn;
  do {
    pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                       (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,iVar9);
    if (0 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_) {
      iVar9 = 0;
      do {
        b = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(modelDescription->input_).super_RepeatedPtrFieldBase,iVar9);
        bVar4 = CoreML::Specification::isEquivalent(pTVar5,b);
        if (bVar4) goto LAB_003078a1;
        iVar9 = iVar9 + 1;
      } while (iVar9 < (modelDescription->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (iStack_f0._M_current == local_e8) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&local_f8,iStack_f0,(int *)local_d8);
    }
    else {
      *iStack_f0._M_current = local_d8._0_4_;
      iStack_f0._M_current = iStack_f0._M_current + 1;
    }
LAB_003078a1:
    iVar9 = local_d8._0_4_ + LOGLEVEL_WARNING;
    local_d8._0_4_ = iVar9;
    iVar2 = (modelDescription->traininginput_).super_RepeatedPtrFieldBase.current_size_;
  } while (iVar9 < iVar2);
  if ((long)iStack_f0._M_current - (long)local_f8 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x3ba202);
    __return_storage_ptr__ = local_100;
    CoreML::Result::Result(local_100,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_a0);
  }
  else if ((long)iStack_f0._M_current - (long)local_f8 >> 2 == (long)iVar2) {
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)local_a0._M_string_length,0x3ba265);
    __return_storage_ptr__ = local_100;
    CoreML::Result::Result(local_100,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_a0);
  }
  else {
    paVar1 = &local_80.field_2;
    local_80._M_string_length = 0;
    local_80.field_2._M_local_buf[0] = '\0';
    puVar8 = (undefined1 *)local_60->updateparams_;
    if ((NetworkUpdateParameters *)puVar8 == (NetworkUpdateParameters *)0x0) {
      puVar8 = CoreML::Specification::_NetworkUpdateParameters_default_instance_;
    }
    local_80._M_dataplus._M_p = (pointer)paVar1;
    if ((((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.current_size_
        < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                 ,0x358);
      pLVar6 = google::protobuf::internal::LogMessage::operator<<
                         ((LogMessage *)local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_101,pLVar6);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d8);
    }
    iVar9 = *(int *)((long)((((NetworkUpdateParameters *)puVar8)->losslayers_).
                            super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24);
    iVar2 = (((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.
            current_size_;
    if (iVar9 == 10) {
      if (iVar2 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar6 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_d8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_101,pLVar6);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d8);
      }
LAB_00307af3:
      std::__cxx11::string::_M_assign((string *)&local_80);
    }
    else {
      if (iVar2 < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        pLVar6 = google::protobuf::internal::LogMessage::operator<<
                           ((LogMessage *)local_d8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_101,pLVar6);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d8);
        iVar9 = *(int *)((long)((((NetworkUpdateParameters *)puVar8)->losslayers_).
                                super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x24);
      }
      if (iVar9 == 0xb) {
        if ((((NetworkUpdateParameters *)puVar8)->losslayers_).super_RepeatedPtrFieldBase.
            current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)local_d8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                     ,0x358);
          pLVar6 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)local_d8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=(&local_101,pLVar6);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_d8);
        }
        goto LAB_00307af3;
      }
    }
    if (iStack_f0._M_current == local_f8) {
LAB_00307bcd:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                     "The training inputs don\'t include the loss layer\'s target: ",&local_80);
      std::__cxx11::string::operator=((string *)&local_a0,(string *)local_d8);
      __return_storage_ptr__ = local_100;
      if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
        operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
      }
      CoreML::Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_a0)
      ;
    }
    else {
      uVar10 = 0;
      bVar4 = false;
      do {
        pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(modelDescription->traininginput_).super_RepeatedPtrFieldBase,
                            local_f8[uVar10]);
        plVar7 = (long *)((ulong)(pTVar5->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
        lVar3 = *plVar7;
        local_d8._0_8_ = local_d8 + 0x10;
        std::__cxx11::string::_M_construct<char*>((string *)local_d8,lVar3,plVar7[1] + lVar3);
        if ((local_80._M_string_length == local_d8._8_8_) &&
           (((char *)local_80._M_string_length == (char *)0x0 ||
            (iVar9 = bcmp(local_80._M_dataplus._M_p,(void *)local_d8._0_8_,local_80._M_string_length
                         ), iVar9 == 0)))) {
          bVar4 = true;
        }
        if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
          operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
        }
        __return_storage_ptr__ = local_100;
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)((long)iStack_f0._M_current - (long)local_f8 >> 2));
      if (!bVar4) goto LAB_00307bcd;
      CoreML::Result::Result(local_100);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p,
                      CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                               local_80.field_2._M_local_buf[0]) + 1);
    }
  }
  if (local_f8 != (int *)0x0) {
    operator_delete(local_f8,(long)local_e8 - (long)local_f8);
  }
LAB_00307c5d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.m_message._M_dataplus._M_p != &local_58.m_message.field_2) {
    operator_delete(local_58.m_message._M_dataplus._M_p,
                    local_58.m_message.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result validateTrainingInputs(const Specification::ModelDescription& modelDescription, const T& nn) {
    Result r;
    std::string err;

    if (modelDescription.traininginput_size() <= 1) {
        err = "Must provide training inputs for updatable neural network (expecting both input and target for loss function).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::vector<int> trainingInputExclusiveIndices;
    for (int i = 0; i < modelDescription.traininginput_size(); i++) {
        const Specification::FeatureDescription& trainingInput = modelDescription.traininginput(i);
        bool trainingInputIsPredictionInput = false;
        for (int j = 0; j < modelDescription.input_size(); j++) {
            const Specification::FeatureDescription& input = modelDescription.input(j);
            if (Specification::isEquivalent(trainingInput, input)) {
                trainingInputIsPredictionInput = true;
                break;
            }
        }
        if (!trainingInputIsPredictionInput) {
            trainingInputExclusiveIndices.push_back(i);
        }
    }

    // Check that training inputs are specified to at least contain the target (which we'll validate is the target further down)
    if (trainingInputExclusiveIndices.size() < 1) {
        err = "Training inputs don't describe required inputs for the loss (needs both the input and the target).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    // Ensure other inputs (excluding the target) are present
    // This should prevent issues where the only training input described is the target itself
    // Given we don't yet know what inputs are explicitly required for training we can't vet beyond this for what model inputs to require
    size_t numberOfNonExclusiveTrainingInputs = static_cast<size_t>(modelDescription.traininginput_size()) - trainingInputExclusiveIndices.size();
    if (numberOfNonExclusiveTrainingInputs <= 0) { // Given at least one input from the inference model's inputs must be supplied this should be positive
        err = "The training inputs must include at least one input from the model itself as required for training (should have at least one input in common with those used for prediction).";
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    std::string target;
    const Specification::NetworkUpdateParameters& updateParams = nn.updateparams();
    if (updateParams.losslayers(0).has_categoricalcrossentropylosslayer()) {
        target = updateParams.losslayers(0).categoricalcrossentropylosslayer().target();
    } else if (updateParams.losslayers(0).has_meansquarederrorlosslayer()) {
        target = updateParams.losslayers(0).meansquarederrorlosslayer().target();
    }

    bool isClassifier = (dynamic_cast<const Specification::NeuralNetworkClassifier*>(&nn) != nullptr);

    bool trainingInputMeetsRequirement = false;
    for (size_t i = 0; i < trainingInputExclusiveIndices.size(); i++) {
        const Specification::FeatureDescription& trainingInputDescription = modelDescription.traininginput(trainingInputExclusiveIndices[i]);
        std::string trainingInputTarget = trainingInputDescription.name();

        // If the neural network is a classifier, check if the predictedFeatureNames is a training input (and ensure matching types)
        if (isClassifier) {
            if (trainingInputTarget == modelDescription.predictedfeaturename()) {

                // Find the predictedFeatureName's output and use to check types
                for (const auto& output : modelDescription.output()) {
                    if (trainingInputTarget == output.name()) {
                        if (trainingInputDescription.type() == output.type()) {
                            trainingInputMeetsRequirement = true;
                            break;
                        } else {
                            std::string typeString = output.type().has_int64type() ? "Int64" : "String";
                            std::string targetTypeString = trainingInputDescription.type().has_int64type() ? "Int64" : "String";
                            err = "The type of the training input provided: " + trainingInputTarget + " doesn't match the expected type of the classifier. Found: " + targetTypeString + ", expected: " + typeString + ".";
                            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
                        }
                    }
                }
            }
        }

        // If NN was not a classifier (or predictedFeatureName was not in the training inputs), ensure the target is in the training inputs
        if (target == trainingInputTarget) {
            trainingInputMeetsRequirement = true;
        }
    }

    // Raise an error if the target isn't found (or if the target or predictedFeatureNames aren't found for classifiers)
    // Users can supply either / or for a classifier, but if neither is found we'll request the predictedFeatureNames
    if (!trainingInputMeetsRequirement) {
        if (isClassifier) {
            err = "The training inputs don't include the target of the classifier: " + modelDescription.predictedfeaturename();
            return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
        }
        err = "The training inputs don't include the loss layer's target: " + target;
        return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION, err);
    }

    return Result();
}